

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# untyped_message.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::MakeInvalidLengthDelimType
          (json_internal *this,int kind,int field_number)

{
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355>
  local_58;
  string local_48;
  undefined1 local_28 [16];
  int local_18;
  int local_14;
  int field_number_local;
  int kind_local;
  
  local_18 = field_number;
  local_14 = kind;
  _field_number_local = this;
  absl::lts_20240722::str_format_internal::
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355,_(absl::lts_20240722::FormatConversionCharSet)655355>
  ::FormatSpecTemplate(&local_58,"field type %d (number %d) does not support type 2 records");
  absl::lts_20240722::StrFormat<int,_int>(&local_48,&local_58,&local_14,&local_18);
  local_28 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  absl::lts_20240722::InvalidArgumentError(this,local_28._0_8_,local_28._8_8_);
  std::__cxx11::string::~string((string *)&local_48);
  return (Status)(uintptr_t)this;
}

Assistant:

PROTOBUF_NOINLINE static absl::Status MakeInvalidLengthDelimType(
    int kind, int field_number) {
  return absl::InvalidArgumentError(absl::StrFormat(
      "field type %d (number %d) does not support type 2 records", kind,
      field_number));
}